

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitplanes.cpp
# Opt level: O0

void __thiscall
Amiga::BitplaneShifter::set
          (BitplaneShifter *this,BitplaneData *previous,BitplaneData *next,int odd_delay,
          int even_delay)

{
  value_type_conflict4 vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  const_reference pvVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  reference pvVar15;
  byte bVar16;
  byte bVar17;
  uint16_t planes [6];
  int even_delay_local;
  int odd_delay_local;
  BitplaneData *next_local;
  BitplaneData *previous_local;
  BitplaneShifter *this_local;
  
  pvVar8 = std::array<unsigned_short,_6UL>::operator[]
                     (&previous->super_array<unsigned_short,_6UL>,0);
  vVar1 = *pvVar8;
  pvVar8 = std::array<unsigned_short,_6UL>::operator[](&next->super_array<unsigned_short,_6UL>,0);
  bVar16 = (byte)even_delay;
  iVar2 = CONCAT22(vVar1,*pvVar8) >> (bVar16 & 0x1f);
  pvVar8 = std::array<unsigned_short,_6UL>::operator[]
                     (&previous->super_array<unsigned_short,_6UL>,1);
  vVar1 = *pvVar8;
  pvVar8 = std::array<unsigned_short,_6UL>::operator[](&next->super_array<unsigned_short,_6UL>,1);
  bVar17 = (byte)odd_delay;
  iVar3 = CONCAT22(vVar1,*pvVar8) >> (bVar17 & 0x1f);
  pvVar8 = std::array<unsigned_short,_6UL>::operator[]
                     (&previous->super_array<unsigned_short,_6UL>,2);
  vVar1 = *pvVar8;
  pvVar8 = std::array<unsigned_short,_6UL>::operator[](&next->super_array<unsigned_short,_6UL>,2);
  iVar4 = CONCAT22(vVar1,*pvVar8) >> (bVar16 & 0x1f);
  pvVar8 = std::array<unsigned_short,_6UL>::operator[]
                     (&previous->super_array<unsigned_short,_6UL>,3);
  vVar1 = *pvVar8;
  pvVar8 = std::array<unsigned_short,_6UL>::operator[](&next->super_array<unsigned_short,_6UL>,3);
  iVar5 = CONCAT22(vVar1,*pvVar8) >> (bVar17 & 0x1f);
  pvVar8 = std::array<unsigned_short,_6UL>::operator[]
                     (&previous->super_array<unsigned_short,_6UL>,4);
  vVar1 = *pvVar8;
  pvVar8 = std::array<unsigned_short,_6UL>::operator[](&next->super_array<unsigned_short,_6UL>,4);
  iVar6 = CONCAT22(vVar1,*pvVar8) >> (bVar16 & 0x1f);
  pvVar8 = std::array<unsigned_short,_6UL>::operator[]
                     (&previous->super_array<unsigned_short,_6UL>,5);
  vVar1 = *pvVar8;
  pvVar8 = std::array<unsigned_short,_6UL>::operator[](&next->super_array<unsigned_short,_6UL>,5);
  iVar7 = CONCAT22(vVar1,*pvVar8) >> (bVar17 & 0x1f);
  uVar9 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)iVar2);
  uVar10 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)iVar4);
  uVar11 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)iVar6);
  uVar12 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)iVar3);
  uVar13 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)iVar5);
  uVar14 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)iVar7);
  pvVar15 = std::array<unsigned_long,_2UL>::operator[](&this->data_,0);
  *pvVar15 = uVar9 | uVar10 << 1 | uVar11 << 2 | uVar12 << 3 | uVar13 << 4 | uVar14 << 5;
  uVar9 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)((uint)iVar2 >> 8));
  uVar10 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)((uint)iVar4 >> 8));
  uVar11 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)((uint)iVar6 >> 8));
  uVar12 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)((uint)iVar3 >> 8));
  uVar13 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)((uint)iVar5 >> 8));
  uVar14 = anon_unknown.dwarf_63f548::expand_bitplane_byte((uint8_t)((uint)iVar7 >> 8));
  pvVar15 = std::array<unsigned_long,_2UL>::operator[](&this->data_,1);
  *pvVar15 = uVar9 | uVar10 << 1 | uVar11 << 2 | uVar12 << 3 | uVar13 << 4 | uVar14 << 5;
  return;
}

Assistant:

void BitplaneShifter::set(const BitplaneData &previous, const BitplaneData &next, int odd_delay, int even_delay) {
	const uint16_t planes[6] = {
		uint16_t(((previous[0] << 16) | next[0]) >> even_delay),
		uint16_t(((previous[1] << 16) | next[1]) >> odd_delay),
		uint16_t(((previous[2] << 16) | next[2]) >> even_delay),
		uint16_t(((previous[3] << 16) | next[3]) >> odd_delay),
		uint16_t(((previous[4] << 16) | next[4]) >> even_delay),
		uint16_t(((previous[5] << 16) | next[5]) >> odd_delay),
	};

	// Swizzle bits into the form:
	//
	//	[b5 b3 b1 b4 b2 b0]
	//
	// ... and assume a suitably adjusted palette is in use elsewhere.
	// This makes dual playfields very easy to separate.
	data_[0] =
		(expand_bitplane_byte(uint8_t(planes[0])) << 0) |
		(expand_bitplane_byte(uint8_t(planes[2])) << 1) |
		(expand_bitplane_byte(uint8_t(planes[4])) << 2) |
		(expand_bitplane_byte(uint8_t(planes[1])) << 3) |
		(expand_bitplane_byte(uint8_t(planes[3])) << 4) |
		(expand_bitplane_byte(uint8_t(planes[5])) << 5);

	data_[1] =
		(expand_bitplane_byte(uint8_t(planes[0] >> 8)) << 0) |
		(expand_bitplane_byte(uint8_t(planes[2] >> 8)) << 1) |
		(expand_bitplane_byte(uint8_t(planes[4] >> 8)) << 2) |
		(expand_bitplane_byte(uint8_t(planes[1] >> 8)) << 3) |
		(expand_bitplane_byte(uint8_t(planes[3] >> 8)) << 4) |
		(expand_bitplane_byte(uint8_t(planes[5] >> 8)) << 5);
}